

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

file_status
ghc::filesystem::detail::status_ex
          (path *p,error_code *ec,file_status *sls,uintmax_t *sz,uintmax_t *nhl,time_t *lwt,
          int recurse_count)

{
  file_status fVar1;
  bool bVar2;
  file_type fVar3;
  value_type *pvVar4;
  error_code eVar5;
  undefined4 in_stack_0000000c;
  undefined4 uStack_e4;
  file_status local_d8;
  undefined1 local_cd;
  int local_cc;
  undefined1 local_c8 [4];
  int result;
  stat st;
  uintmax_t *nhl_local;
  uintmax_t *sz_local;
  file_status *sls_local;
  error_code *ec_local;
  path *p_local;
  file_status *fs;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)lwt;
  std::error_code::clear((error_code *)sls);
  pvVar4 = filesystem::path::c_str((path *)ec);
  local_cc = lstat(pvVar4,(stat *)local_c8);
  if (local_cc == 0) {
    std::error_code::clear((error_code *)sls);
    local_cd = 0;
    file_status_from_st_mode<unsigned_int>((detail *)p,(uint)st.st_nlink);
    fVar3 = file_status::type((file_status *)p);
    if (fVar3 == symlink) {
      pvVar4 = filesystem::path::c_str((path *)ec);
      local_cc = stat(pvVar4,(stat *)local_c8);
      if (local_cc == 0) {
        if (sz != (uintmax_t *)0x0) {
          file_status::operator=((file_status *)sz,(file_status *)p);
        }
        file_status_from_st_mode<unsigned_int>((detail *)&local_d8,(uint)st.st_nlink);
        file_status::operator=((file_status *)p,&local_d8);
        file_status::~file_status(&local_d8);
      }
    }
    if (nhl != (uintmax_t *)0x0) {
      *nhl = st.st_rdev;
    }
    if (st.__glibc_reserved[2] != 0) {
      *(__ino_t *)st.__glibc_reserved[2] = st.st_ino;
    }
    if (CONCAT44(in_stack_0000000c,recurse_count) != 0) {
      *(__syscall_slong_t *)CONCAT44(in_stack_0000000c,recurse_count) = st.st_atim.tv_nsec;
    }
  }
  else {
    eVar5 = make_system_error(0);
    fVar1._4_4_ = uStack_e4;
    fVar1._type = eVar5._M_value;
    *sls = fVar1;
    sls[1] = (file_status)eVar5._M_cat;
    bVar2 = is_not_found_error((error_code *)sls);
    if (bVar2) {
      file_status::file_status((file_status *)p,not_found,unknown);
    }
    else {
      file_status::file_status((file_status *)p,none,unknown);
    }
  }
  return (file_status)p;
}

Assistant:

GHC_INLINE file_status status_ex(const path& p, std::error_code& ec, file_status* sls = nullptr, uintmax_t* sz = nullptr, uintmax_t* nhl = nullptr, time_t* lwt = nullptr, int recurse_count = 0) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (recurse_count > 16) {
        ec = detail::make_system_error(0x2A9 /*ERROR_STOPPED_ON_SYMLINK*/);
        return file_status(file_type::unknown);
    }
    WIN32_FILE_ATTRIBUTE_DATA attr;
    if (!::GetFileAttributesExW(p.wstring().c_str(), GetFileExInfoStandard, &attr)) {
        ec = detail::make_system_error();
    }
    else if (attr.dwFileAttributes & FILE_ATTRIBUTE_REPARSE_POINT) {
        path target = resolveSymlink(p, ec);
        file_status result;
        if (!ec && !target.empty()) {
            if (sls) {
                *sls = status_from_INFO(p, &attr, ec);
            }
            return detail::status_ex(target, ec, nullptr, sz, nhl, lwt, recurse_count + 1);
        }
        return file_status(file_type::unknown);
    }
    if (ec) {
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found);
        }
        return file_status(file_type::none);
    }
    if (nhl) {
        *nhl = 0;
    }
    return detail::status_from_INFO(p, &attr, ec, sz, lwt);
#else
    (void)recurse_count;
    struct ::stat st;
    auto result = ::lstat(p.c_str(), &st);
    if (result == 0) {
        ec.clear();
        file_status fs = detail::file_status_from_st_mode(st.st_mode);
        if (fs.type() == file_type::symlink) {
            result = ::stat(p.c_str(), &st);
            if (result == 0) {
                if (sls) {
                    *sls = fs;
                }
                fs = detail::file_status_from_st_mode(st.st_mode);
            }
        }
        if (sz) {
            *sz = static_cast<uintmax_t>(st.st_size);
        }
        if (nhl) {
            *nhl = st.st_nlink;
        }
        if (lwt) {
            *lwt = st.st_mtime;
        }
        return fs;
    }
    else {
        ec = detail::make_system_error();
        if (detail::is_not_found_error(ec)) {
            return file_status(file_type::not_found, perms::unknown);
        }
        return file_status(file_type::none);
    }
#endif
}